

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * ImageText(Image *__return_storage_ptr__,char *text,int fontSize,Color color)

{
  Font font;
  ulong uVar1;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar1 = (ulong)(uint)fontSize;
  if (fontSize < 0xb) {
    uVar1 = 10;
  }
  GetFontDefault();
  font._8_8_ = uStack_58;
  font._0_8_ = local_60;
  font.texture._4_8_ = local_50;
  font.texture._12_8_ = uStack_48;
  font.recs = (Rectangle *)local_40;
  font.glyphs = uStack_38;
  ImageTextEx(__return_storage_ptr__,font,text,(float)(int)uVar1,(float)(int)(uVar1 / 10),color);
  return __return_storage_ptr__;
}

Assistant:

Image ImageText(const char *text, int fontSize, Color color)
{
    Image imText = { 0 };
#if defined(SUPPORT_MODULE_RTEXT)
    int defaultFontSize = 10;   // Default Font chars height in pixel
    if (fontSize < defaultFontSize) fontSize = defaultFontSize;
    int spacing = fontSize/defaultFontSize;
    imText = ImageTextEx(GetFontDefault(), text, (float)fontSize, (float)spacing, color);   // WARNING: Module required: rtext
#else
    imText = GenImageColor(200, 60, BLACK);     // Generating placeholder black image rectangle
    TRACELOG(LOG_WARNING, "IMAGE: ImageTextEx() requires module: rtext");
#endif
    return imText;
}